

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void tinygltf::UpdateImageObject
               (Image *image,string *baseDir,int index,bool embedImages,
               WriteImageDataFunction *WriteImageData,void *user_data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string uri;
  string ext;
  string filename;
  string local_d8;
  void *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  this = &local_d8;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90.field_2._M_local_buf[0] = '\0';
  local_b8 = user_data;
  if ((image->uri)._M_string_length == 0) {
    if ((image->name)._M_string_length == 0) {
      MimeToExt(&local_d8,&image->mimeType);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::to_string(&local_50,index);
      std::operator+(&local_b0,&local_50,".");
      std::operator+(&local_d8,&local_b0,&local_90);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b0);
      this = &local_50;
    }
    else {
      MimeToExt(&local_d8,&image->mimeType);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::operator+(&local_b0,&image->name,".");
      std::operator+(&local_d8,&local_b0,&local_90);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      this = &local_b0;
    }
  }
  else {
    GetBaseFilename(&local_d8,&image->uri);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    GetFilePathExtension(&local_d8,&local_70);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d8);
  }
  std::__cxx11::string::~string((string *)this);
  if (*WriteImageData != (WriteImageDataFunction)0x0) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    (**WriteImageData)(baseDir,&local_70,image,embedImages,local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

static void UpdateImageObject(Image &image, std::string &baseDir, int index,
                              bool embedImages,
                              WriteImageDataFunction *WriteImageData = nullptr,
                              void *user_data = nullptr) {
  std::string filename;
  std::string ext;

  // If image have uri. Use it it as a filename
  if (image.uri.size()) {
    filename = GetBaseFilename(image.uri);
    ext = GetFilePathExtension(filename);

  } else if (image.name.size()) {
    ext = MimeToExt(image.mimeType);
    // Otherwise use name as filename
    filename = image.name + "." + ext;
  } else {
    ext = MimeToExt(image.mimeType);
    // Fallback to index of image as filename
    filename = std::to_string(index) + "." + ext;
  }

  // If callback is set, modify image data object
  if (*WriteImageData != nullptr) {
    std::string uri;
    (*WriteImageData)(&baseDir, &filename, &image, embedImages, user_data);
  }
}